

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::CompilerMSL(CompilerMSL *this,ParsedIR *ir_)

{
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [13];
  ParsedIR *local_18;
  ParsedIR *ir__local;
  CompilerMSL *this_local;
  
  local_18 = ir_;
  ir__local = (ParsedIR *)this;
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerMSL_00751000;
  ::std::
  unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->function_global_vars);
  this->builtin_frag_coord_id = 0;
  this->builtin_sample_id_id = 0;
  this->builtin_sample_mask_id = 0;
  this->builtin_helper_invocation_id = 0;
  this->builtin_vertex_idx_id = 0;
  this->builtin_base_vertex_id = 0;
  this->builtin_instance_idx_id = 0;
  this->builtin_base_instance_id = 0;
  this->builtin_view_idx_id = 0;
  this->builtin_layer_id = 0;
  this->builtin_invocation_id_id = 0;
  this->builtin_primitive_id_id = 0;
  this->builtin_subgroup_invocation_id_id = 0;
  this->builtin_subgroup_size_id = 0;
  this->builtin_dispatch_base_id = 0;
  this->builtin_stage_input_size_id = 0;
  this->builtin_local_invocation_index_id = 0;
  this->builtin_workgroup_size_id = 0;
  this->builtin_mesh_primitive_indices_id = 0;
  this->builtin_mesh_sizes_id = 0;
  this->builtin_task_grid_id = 0;
  this->builtin_frag_depth_id = 0;
  this->swizzle_buffer_id = 0;
  this->buffer_size_buffer_id = 0;
  this->view_mask_buffer_id = 0;
  this->dynamic_offsets_buffer_id = 0;
  this->uint_type_id = 0;
  this->shared_uint_type_id = 0;
  this->meshlet_type_id = 0;
  this->argument_buffer_padding_buffer_type_id = 0;
  this->argument_buffer_padding_image_type_id = 0;
  this->argument_buffer_padding_sampler_type_id = 0;
  this->does_shader_write_sample_mask = false;
  this->frag_shader_needs_discard_checks = false;
  Options::Options(&this->msl_options);
  ::std::
  set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
  ::set(&this->spv_function_implementations);
  ::std::
  map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
  ::map(&this->inputs_by_location);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
  ::unordered_map(&this->inputs_by_builtin);
  ::std::
  map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
  ::map(&this->outputs_by_location);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
  ::unordered_map(&this->outputs_by_builtin);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->location_inputs_in_use);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->location_inputs_in_use_fallback);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->location_outputs_in_use);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->location_outputs_in_use_fallback);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->fragment_output_components);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->builtin_to_automatic_input_location);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->builtin_to_automatic_output_location);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->pragma_lines);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->typedef_lines);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->vars_needing_early_declaration);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->constant_macro_ids);
  ::std::
  unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
  ::unordered_map(&this->resource_bindings);
  ::std::
  unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
  ::unordered_map(&this->resource_arg_buff_idx_to_binding_number);
  this->next_metal_resource_index_buffer = 0;
  this->next_metal_resource_index_texture = 0;
  this->next_metal_resource_index_sampler = 0;
  TypedID<(spirv_cross::Types)2>::TypedID(&this->stage_in_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->stage_out_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->patch_stage_in_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->patch_stage_out_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->stage_in_ptr_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->stage_out_ptr_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->tess_level_inner_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->tess_level_outer_var_id,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->mesh_out_per_vertex,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->mesh_out_per_primitive,0);
  TypedID<(spirv_cross::Types)2>::TypedID(&this->stage_out_masked_builtin_type_id,0);
  this->needs_base_vertex_arg = Neutral;
  this->needs_base_instance_arg = Neutral;
  this->has_sampled_images = false;
  this->builtin_declaration = false;
  this->is_using_builtin_array = false;
  this->is_rasterization_disabled = false;
  this->capture_output_to_buffer = false;
  this->needs_swizzle_buffer_def = false;
  this->used_swizzle_buffer = false;
  this->added_builtin_tess_level = false;
  this->needs_subgroup_invocation_id = false;
  this->needs_subgroup_size = false;
  this->needs_sample_id = false;
  this->needs_helper_invocation = false;
  this->needs_workgroup_zero_init = false;
  this->writes_to_depth = false;
  ::std::__cxx11::string::string((string *)&this->qual_pos_var_name);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->stage_in_var_name,"in",local_25);
  ::std::allocator<char>::~allocator((allocator<char> *)local_25);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->stage_out_var_name,"out",&local_26);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->patch_stage_in_var_name,"patchIn",&local_27);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->patch_stage_out_var_name,"patchOut",&local_28);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->sampler_name_suffix,"Smplr",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->swizzle_name_suffix,"Swzl",&local_2a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->buffer_size_name_suffix,"BufferSize",&local_2b);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->plane_name_suffix,"Plane",&local_2c);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->input_wg_var_name,"gl_in",&local_2d);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->input_buffer_var_name,"spvIn",&local_2e);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->output_buffer_var_name,"spvOut",&local_2f);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&this->patch_input_buffer_var_name,"spvPatchIn",&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&this->patch_output_buffer_var_name,"spvPatchOut",&local_31);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&this->tess_factor_buffer_var_name,"spvTessLevel",&local_32);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_32);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->index_buffer_var_name,"spvIndices",&local_33);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_33);
  this->previous_instruction_opcode = OpNop;
  ::std::
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  ::map(&this->constexpr_samplers_by_id);
  ::std::
  unordered_map<spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_spirv_cross::MSLConstexprSampler>_>_>
  ::unordered_map(&this->constexpr_samplers_by_binding);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->buffers_requiring_array_length);
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::SmallVector
            (&this->buffer_aliases_argument);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->buffer_aliases_discrete);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->atomic_image_vars_emulated);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->pull_model_inputs);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->recursive_inputs);
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::SmallVector(&this->entry_point_bindings);
  ::std::
  map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::map(&this->buffers_requiring_dynamic_offset);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->disabled_frag_outputs);
  ::std::
  unordered_set<spirv_cross::SetBindingPair,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::SetBindingPair>,_std::allocator<spirv_cross::SetBindingPair>_>
  ::unordered_set(&this->inline_uniform_blocks);
  this->argument_buffer_discrete_mask = 0;
  this->argument_buffer_device_storage_mask = 0;
  this->suppress_missing_prototypes = false;
  this->suppress_incompatible_pointer_types_discard_qualifiers = false;
  this->suppress_sometimes_unitialized = false;
  return;
}

Assistant:

CompilerMSL::CompilerMSL(const ParsedIR &ir_)
    : CompilerGLSL(ir_)
{
}